

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O3

void __thiscall icu_63::Formattable::Formattable(Formattable *this,UnicodeString *stringToCopy)

{
  UnicodeString *pUVar1;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003aed78;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003bc258;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fValue).fObject = (UObject *)0x0;
  this->fType = kLong;
  this->fDecimalStr = (CharString *)0x0;
  this->fDecimalQuantity = (DecimalQuantity *)0x0;
  pUVar1 = stringToCopy;
  UnicodeString::setToBogus(&this->fBogus);
  this->fType = kString;
  pUVar1 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar1);
  if (pUVar1 != (UnicodeString *)0x0) {
    UnicodeString::UnicodeString(pUVar1,stringToCopy);
  }
  (this->fValue).fString = pUVar1;
  return;
}

Assistant:

Formattable::Formattable(const UnicodeString& stringToCopy)
{
    init();
    fType = kString;
    fValue.fString = new UnicodeString(stringToCopy);
}